

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ColourGuard * __thiscall
Catch::ColourImpl::ColourGuard::operator=(ColourGuard *this,ColourGuard *rhs)

{
  ColourImpl **in_RSI;
  ColourGuard *in_RDI;
  
  std::swap<Catch::ColourImpl_const*>(&in_RDI->m_colourImpl,in_RSI);
  std::swap<Catch::Colour::Code>(&in_RDI->m_code,(Code *)(in_RSI + 1));
  std::swap<bool>(&in_RDI->m_engaged,(bool *)((long)in_RSI + 0xc));
  return in_RDI;
}

Assistant:

ColourImpl::ColourGuard&
    ColourImpl::ColourGuard::operator=( ColourGuard&& rhs ) noexcept {
        using std::swap;
        swap( m_colourImpl, rhs.m_colourImpl );
        swap( m_code, rhs.m_code );
        swap( m_engaged, rhs.m_engaged );

        return *this;
    }